

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::CheckStatusTest::iterate(CheckStatusTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  int iVar7;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    bVar1 = IncompleteAttachmentTestCase(this);
    bVar2 = MissingAttachmentTestCase(this);
    bVar3 = IncompleteMultisampleRenderbufferTestCase(this);
    bVar4 = IncompleteMultisampleTextureTestCase(this);
    bVar5 = IncompleteLayerTargetsTestCase(this);
    do {
      iVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
    } while (iVar7 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar1 && bVar2) {
      if ((bVar3 && bVar4) && bVar5) {
        description = "Pass";
        testResult = QP_TEST_RESULT_PASS;
      }
      else {
        description = "Pass with Compatibility Warning";
        testResult = QP_TEST_RESULT_COMPATIBILITY_WARNING;
      }
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CheckStatusTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool maybe_ok = true;
	bool is_error = false;

	try
	{
		/* The specification is not clear about framebuffer completness. OpenGL 4.5 core profile
		 specification in chapter 9.4.2 says:
		 "The framebuffer object bound to target is said to be framebuffer complete if all
		 the following conditions are true [...]"
		 It does not say that framebuffer is incomplete when any of the conditions are not met.
		 Due to this wording, except for obvious cases (incomplete attachment and missing attachments)
		 other tests ar optional and may result in QP_TEST_RESULT_COMPATIBILITY_WARNING when fail. */
		is_ok &= IncompleteAttachmentTestCase();
		is_ok &= MissingAttachmentTestCase();

		maybe_ok &= IncompleteMultisampleRenderbufferTestCase();
		maybe_ok &= IncompleteMultisampleTextureTestCase();
		maybe_ok &= IncompleteLayerTargetsTestCase();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		if (maybe_ok)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Pass with Compatibility Warning");
		}
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}